

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::MmapInputFile::MmapInputFile(MmapInputFile *this,string_view filename,string_view data)

{
  (this->super_InputFile)._vptr_InputFile = (_func_int **)&PTR___cxa_pure_virtual_0061e210;
  (this->super_InputFile).filename_._M_dataplus._M_p =
       (pointer)&(this->super_InputFile).filename_.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_InputFile).filename_,filename._M_str,
             filename._M_str + filename._M_len);
  (this->super_InputFile)._vptr_InputFile = (_func_int **)&PTR_TryOpen_0061e0f0;
  (this->super_InputFile).data_._M_len = data._M_len;
  (this->super_InputFile).data_._M_str = data._M_str;
  return;
}

Assistant:

MmapInputFile::MmapInputFile(string_view filename, string_view data)
    : InputFile(filename) {
  data_ = data;
}